

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.cpp
# Opt level: O2

bool ApprovalTests::StringUtils::beginsWith(string *value,string *beginning)

{
  char *__first1;
  bool bVar1;
  
  if (value->_M_string_length < beginning->_M_string_length) {
    return false;
  }
  __first1 = (beginning->_M_dataplus)._M_p;
  bVar1 = Catch::clara::std::__equal<true>::equal<char>
                    (__first1,__first1 + beginning->_M_string_length,(value->_M_dataplus)._M_p);
  return bVar1;
}

Assistant:

APPROVAL_TESTS_NO_DISCARD
    bool StringUtils::beginsWith(std::string value, std::string beginning)
    {
        if (value.size() < beginning.size())
        {
            return false;
        }
        return std::equal(beginning.begin(), beginning.end(), value.begin());
    }